

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_buffered_data.cpp
# Opt level: O3

StreamExecutionResult __thiscall
duckdb::SimpleBufferedData::ExecuteTaskInternal
          (SimpleBufferedData *this,StreamQueryResult *result,ClientContextLock *context_lock)

{
  bool bVar1;
  PendingExecutionResult value;
  ClientContext *pCVar2;
  InternalException *this_00;
  StreamExecutionResult SVar3;
  byte bVar4;
  shared_ptr<duckdb::ClientContext,_true> cc;
  shared_ptr<duckdb::ClientContext,_true> local_80;
  string local_70;
  string local_50;
  
  weak_ptr<duckdb::ClientContext,_true>::lock((weak_ptr<duckdb::ClientContext,_true> *)&local_80);
  SVar3 = EXECUTION_CANCELLED;
  if (local_80.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->(&local_80);
    bVar1 = ClientContext::IsActiveResult(pCVar2,context_lock,(BaseQueryResult *)result);
    if (bVar1) {
      if ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size) {
        (*(this->super_BufferedData)._vptr_BufferedData[4])(this);
        pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->(&local_80);
        value = ClientContext::ExecuteTaskInternal
                          (pCVar2,context_lock,(BaseQueryResult *)result,false);
        if ((this->buffered_count).super___atomic_base<unsigned_long>._M_i < this->buffer_size) {
          SVar3 = BLOCKED;
          if ((value != RESULT_READY) && (value != BLOCKED)) {
            bVar1 = BaseQueryResult::HasError((BaseQueryResult *)result);
            if (bVar1) {
              ::std::__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>::reset
                        ((__weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2> *)
                         &(this->super_BufferedData).context);
            }
            bVar4 = value - RESULT_NOT_READY;
            if ((4 < bVar4) || ((0x1bU >> (bVar4 & 0x1f) & 1) == 0)) {
              this_00 = (InternalException *)__cxa_allocate_exception(0x10);
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,
                         "No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
                         "");
              EnumUtil::ToString<duckdb::PendingExecutionResult>(&local_50,value);
              InternalException::InternalException<std::__cxx11::string>
                        (this_00,&local_70,&local_50);
              __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error)
              ;
            }
            SVar3 = (StreamExecutionResult)(0x601010201 >> ((bVar4 & 7) << 3));
          }
          goto LAB_01649248;
        }
      }
      SVar3 = CHUNK_READY;
    }
  }
LAB_01649248:
  if (local_80.internal.super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.internal.
               super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return SVar3;
}

Assistant:

StreamExecutionResult SimpleBufferedData::ExecuteTaskInternal(StreamQueryResult &result,
                                                              ClientContextLock &context_lock) {
	auto cc = context.lock();
	if (!cc) {
		return StreamExecutionResult::EXECUTION_CANCELLED;
	}
	if (!cc->IsActiveResult(context_lock, result)) {
		return StreamExecutionResult::EXECUTION_CANCELLED;
	}
	if (BufferIsFull()) {
		// The buffer isn't empty yet, just return
		return StreamExecutionResult::CHUNK_READY;
	}
	UnblockSinks();
	// Let the executor run until the buffer is no longer empty
	auto execution_result = cc->ExecuteTaskInternal(context_lock, result);
	if (buffered_count >= BufferSize()) {
		return StreamExecutionResult::CHUNK_READY;
	}
	if (execution_result == PendingExecutionResult::BLOCKED ||
	    execution_result == PendingExecutionResult::RESULT_READY) {
		return StreamExecutionResult::BLOCKED;
	}
	if (result.HasError()) {
		Close();
	}
	switch (execution_result) {
	case PendingExecutionResult::NO_TASKS_AVAILABLE:
	case PendingExecutionResult::RESULT_NOT_READY:
		return StreamExecutionResult::CHUNK_NOT_READY;
	case PendingExecutionResult::EXECUTION_FINISHED:
		return StreamExecutionResult::EXECUTION_FINISHED;
	case PendingExecutionResult::EXECUTION_ERROR:
		return StreamExecutionResult::EXECUTION_ERROR;
	default:
		throw InternalException("No conversion from PendingExecutionResult (%s) -> StreamExecutionResult",
		                        EnumUtil::ToString(execution_result));
	}
}